

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O0

int ddTreeSiftingAux(DdManager *table,MtrNode *treenode,Cudd_ReorderingType method)

{
  Cudd_AggregationType CVar1;
  int iVar2;
  int local_34;
  Cudd_AggregationType saveCheck;
  int res;
  MtrNode *auxnode;
  Cudd_ReorderingType method_local;
  MtrNode *treenode_local;
  DdManager *table_local;
  
  _saveCheck = treenode;
  do {
    if (_saveCheck == (MtrNode *)0x0) {
      return 1;
    }
    if (_saveCheck->child == (MtrNode *)0x0) {
      if ((1 < _saveCheck->size) && (iVar2 = ddReorderChildren(table,_saveCheck,method), iVar2 == 0)
         ) {
        return 0;
      }
    }
    else {
      iVar2 = ddTreeSiftingAux(table,_saveCheck->child,method);
      if (iVar2 == 0) {
        return 0;
      }
      CVar1 = table->groupcheck;
      table->groupcheck = CUDD_NO_CHECK;
      if (method == CUDD_REORDER_LAZY_SIFT) {
        local_34 = ddReorderChildren(table,_saveCheck,CUDD_REORDER_LAZY_SIFT);
      }
      else {
        local_34 = ddReorderChildren(table,_saveCheck,CUDD_REORDER_GROUP_SIFT);
      }
      table->groupcheck = CVar1;
      if (local_34 == 0) {
        return 0;
      }
    }
    _saveCheck = _saveCheck->younger;
  } while( true );
}

Assistant:

static int
ddTreeSiftingAux(
  DdManager * table,
  MtrNode * treenode,
  Cudd_ReorderingType method)
{
    MtrNode  *auxnode;
    int res;
    Cudd_AggregationType saveCheck;

#ifdef DD_DEBUG
    Mtr_PrintGroups(treenode,1);
#endif

    auxnode = treenode;
    while (auxnode != NULL) {
        if (auxnode->child != NULL) {
            if (!ddTreeSiftingAux(table, auxnode->child, method))
                return(0);
            saveCheck = table->groupcheck;
            table->groupcheck = CUDD_NO_CHECK;
            if (method != CUDD_REORDER_LAZY_SIFT)
              res = ddReorderChildren(table, auxnode, CUDD_REORDER_GROUP_SIFT);
            else
              res = ddReorderChildren(table, auxnode, CUDD_REORDER_LAZY_SIFT);
            table->groupcheck = saveCheck;

            if (res == 0)
                return(0);
        } else if (auxnode->size > 1) {
            if (!ddReorderChildren(table, auxnode, method))
                return(0);
        }
        auxnode = auxnode->younger;
    }

    return(1);

}